

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.h
# Opt level: O1

bool glslang::TDefaultIoResolverBase::isUavType(TType *type)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar2;
  bool bVar3;
  
  iVar1 = (*type->_vptr_TType[0xb])();
  if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0xd) & 0x80) == 0) {
    iVar1 = (*type->_vptr_TType[7])(type);
    if (iVar1 == 0xe) {
      iVar1 = (*type->_vptr_TType[8])(type);
      if ((((*(uint *)CONCAT44(extraout_var_00,iVar1) >> 0x13 & 1) != 0) &&
          (uVar2 = *(uint *)CONCAT44(extraout_var_00,iVar1) & 0xff00, uVar2 != 0x800)) &&
         (uVar2 != 0x700)) {
        return true;
      }
    }
    iVar1 = (*type->_vptr_TType[0xb])(type);
    bVar3 = (*(uint *)(CONCAT44(extraout_var_01,iVar1) + 8) & 0x7f) == 6;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool isUavType(const glslang::TType& type) {
        if (type.getQualifier().isReadOnly())
            return false;
        return (type.getBasicType() == glslang::EbtSampler && type.getSampler().isImage()) ||
                (type.getQualifier().storage == EvqBuffer);
    }